

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateScriptForConfig
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,Indent indent)

{
  cmLocalGenerator *pcVar1;
  string *os_00;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  cmMakefile *pcVar5;
  cmake *this_00;
  ostream *poVar6;
  char *pcVar7;
  char *files_var;
  string *psVar8;
  ulong uVar9;
  WrapQuotes wrapQuotes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  undefined1 auVar10 [16];
  string_view str;
  byte local_5da;
  byte local_4c1;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  int local_404;
  string local_400;
  string local_3e0;
  string local_3c0;
  int local_3a0;
  int local_39c;
  string local_398;
  string local_378;
  undefined1 local_358 [8];
  string result_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string evaluatedRPath;
  string local_2f0;
  Indent local_2cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  string local_2a8;
  cmAlphaNum local_288;
  cmAlphaNum local_258;
  undefined1 local_228 [8];
  string depVar;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [8];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  evaluatedRPaths;
  string local_160;
  int local_140;
  int local_13c;
  int local_138;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string installNameDir;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *config_local;
  ostream *os_local;
  cmInstallRuntimeDependencySetGenerator *this_local;
  Indent indent_local;
  
  local_28 = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  pcVar5 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_INSTALL_NAME_TOOL",&local_49);
  cmMakefile::GetSafeDefinition(pcVar5,&local_48);
  uVar4 = std::__cxx11::string::empty();
  local_4c1 = 0;
  if ((uVar4 & 1) == 0) {
    local_4c1 = this->NoInstallName ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if ((local_4c1 & 1) == 0) goto LAB_0089d046;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"@rpath/",&local_81);
  std::allocator<char>::~allocator(&local_81);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_80,(string *)&this->InstallNameDir);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"${CMAKE_INSTALL_PREFIX}",&local_a9);
    cmGeneratorExpression::ReplaceInstallPrefix((string *)local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::string((string *)&local_f0,(string *)local_80);
    psVar8 = local_28;
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_110);
    cmGeneratorExpression::Evaluate
              (&local_d0,&local_f0,pcVar1,psVar8,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_110);
    std::__cxx11::string::operator=((string *)local_80,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar7 = (char *)std::__cxx11::string::back();
      if (*pcVar7 != '/') {
        std::__cxx11::string::operator+=((string *)local_80,'/');
      }
      goto LAB_0089cf68;
    }
    pcVar5 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
    this_00 = cmMakefile::GetCMakeInstance(pcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"INSTALL_NAME_DIR argument must not evaluate to an empty string"
               ,&local_131);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_130,&(this->super_cmInstallGenerator).Backtrace);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    local_138 = 1;
  }
  else {
LAB_0089cf68:
    local_13c = this_local._4_4_;
    poVar6 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar6 = std::operator<<(poVar6,"set(");
    poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
    poVar6 = std::operator<<(poVar6,"_install_name_dir \"");
    poVar6 = std::operator<<(poVar6,(string *)local_80);
    std::operator<<(poVar6,"\")\n");
    local_138 = 0;
  }
  std::__cxx11::string::~string((string *)local_80);
  if (local_138 != 0) {
    return;
  }
LAB_0089d046:
  local_140 = this_local._4_4_;
  poVar6 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
  poVar6 = std::operator<<(poVar6,"foreach(");
  poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
  poVar6 = std::operator<<(poVar6,"_dep IN LISTS ");
  poVar6 = std::operator<<(poVar6,this->DepsVar);
  std::operator<<(poVar6,")\n");
  pcVar5 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"CMAKE_INSTALL_NAME_TOOL",
             (allocator<char> *)
             ((long)&evaluatedRPaths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmMakefile::GetSafeDefinition(pcVar5,&local_160);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&evaluatedRPaths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (((bVar2 ^ 0xff) & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_258,this->TmpVarPrefix);
    cmAlphaNum::cmAlphaNum(&local_288,"_dep");
    cmStrCat<>((string *)local_228,&local_258,&local_288);
    psVar8 = config_local;
    GetDestination(&local_2a8,this,local_28);
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2c8);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    local_2cc.Level =
         (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    files_var = (char *)std::__cxx11::string::c_str();
    files = &local_2c8;
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,(ostream *)psVar8,&local_2a8,
               cmInstallType_SHARED_LIBRARY,files,false,pcVar7,(char *)0x0,(char *)0x0,
               " FOLLOW_SYMLINK_CHAIN",local_2cc,files_var);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    pcVar5 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"CMAKE_SYSTEM_NAME",
               (allocator<char> *)(evaluatedRPath.field_2._M_local_buf + 0xf));
    psVar8 = cmMakefile::GetSafeDefinition(pcVar5,&local_2f0);
    bVar3 = std::operator==(psVar8,"Linux");
    local_5da = 0;
    if (bVar3) {
      local_5da = this->NoInstallRPath ^ 0xff;
    }
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)(evaluatedRPath.field_2._M_local_buf + 0xf))
    ;
    if ((local_5da & 1) != 0) {
      std::__cxx11::string::string((string *)&__range3);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->InstallRPaths);
      rpath_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->InstallRPaths);
      while( true ) {
        wrapQuotes = (WrapQuotes)files;
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&rpath_1);
        psVar8 = config_local;
        if (!bVar3) break;
        result_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
        std::__cxx11::string::string((string *)&local_378,(string *)result_1.field_2._8_8_);
        psVar8 = local_28;
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string((string *)&local_398);
        files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
        cmGeneratorExpression::Evaluate
                  ((string *)local_358,&local_378,pcVar1,psVar8,(cmGeneratorTarget *)0x0,
                   (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_378);
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)&__range3,':');
            std::__cxx11::string::operator+=((string *)&__range3,(string *)local_358);
          }
          else {
            std::__cxx11::string::operator=((string *)&__range3,(string *)local_358);
          }
        }
        std::__cxx11::string::~string((string *)local_358);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      local_39c = (int)cmScriptGeneratorIndent::Next
                                 ((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
      poVar6 = ::operator<<((ostream *)psVar8,(cmScriptGeneratorIndent)local_39c);
      poVar6 = std::operator<<(poVar6,"get_filename_component(");
      poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
      poVar6 = std::operator<<(poVar6,"_dep_name \"${");
      poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
      std::operator<<(poVar6,"_dep}\" NAME)\n");
      uVar9 = std::__cxx11::string::empty();
      psVar8 = config_local;
      if ((uVar9 & 1) == 0) {
        local_404 = (int)cmScriptGeneratorIndent::Next
                                   ((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
        poVar6 = ::operator<<((ostream *)psVar8,(cmScriptGeneratorIndent)local_404);
        poVar6 = std::operator<<(poVar6,"file(RPATH_SET FILE \"");
        GetDestination(&local_468,this,local_28);
        cmInstallGenerator::ConvertToAbsoluteDestination(&local_448,&local_468);
        cmInstallGenerator::GetDestDirPath(&local_428,&local_448);
        poVar6 = std::operator<<(poVar6,(string *)&local_428);
        poVar6 = std::operator<<(poVar6,"/${");
        poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
        poVar6 = std::operator<<(poVar6,"_dep_name}\" NEW_RPATH ");
        auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range3);
        str._M_len = auVar10._8_8_;
        str._M_str = (char *)0x0;
        cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_488,auVar10._0_8_,str,wrapQuotes);
        poVar6 = std::operator<<(poVar6,(string *)&local_488);
        std::operator<<(poVar6,")\n");
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
      }
      else {
        local_3a0 = (int)cmScriptGeneratorIndent::Next
                                   ((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
        poVar6 = ::operator<<((ostream *)psVar8,(cmScriptGeneratorIndent)local_3a0);
        poVar6 = std::operator<<(poVar6,"file(RPATH_REMOVE FILE \"");
        GetDestination(&local_400,this,local_28);
        cmInstallGenerator::ConvertToAbsoluteDestination(&local_3e0,&local_400);
        cmInstallGenerator::GetDestDirPath(&local_3c0,&local_3e0);
        poVar6 = std::operator<<(poVar6,(string *)&local_3c0);
        poVar6 = std::operator<<(poVar6,"/${");
        poVar6 = std::operator<<(poVar6,this->TmpVarPrefix);
        std::operator<<(poVar6,"_dep_name}\")\n");
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_400);
      }
      std::__cxx11::string::~string((string *)&__range3);
    }
    std::__cxx11::string::~string((string *)local_228);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->InstallRPaths);
    rpath = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->InstallRPaths);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&rpath), os_00 = config_local, psVar8 = local_28, bVar3) {
      result.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_1e0,(string *)result.field_2._8_8_);
      psVar8 = local_28;
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_200);
      cmGeneratorExpression::Evaluate
                ((string *)local_1c0,&local_1e0,pcVar1,psVar8,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2,(value_type *)local_1c0);
      }
      std::__cxx11::string::~string((string *)local_1c0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (this->Type == Library) {
      depVar.field_2._12_4_ =
           cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
      GenerateAppleLibraryScript
                (this,(ostream *)os_00,psVar8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,(Indent)depVar.field_2._12_4_);
    }
    else if (this->Type == Framework) {
      depVar.field_2._8_4_ =
           cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
      GenerateAppleFrameworkScript
                (this,(ostream *)os_00,psVar8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,(Indent)depVar.field_2._8_4_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  poVar6 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
  std::operator<<(poVar6,"endforeach()\n");
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  if (!this->LocalGenerator->GetMakefile()
         ->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL")
         .empty() &&
      !this->NoInstallName) {
    std::string installNameDir = "@rpath/";
    if (!this->InstallNameDir.empty()) {
      installNameDir = this->InstallNameDir;
      cmGeneratorExpression::ReplaceInstallPrefix(installNameDir,
                                                  "${CMAKE_INSTALL_PREFIX}");
      installNameDir = cmGeneratorExpression::Evaluate(
        installNameDir, this->LocalGenerator, config);
      if (installNameDir.empty()) {
        this->LocalGenerator->GetMakefile()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "INSTALL_NAME_DIR argument must not evaluate to an "
          "empty string",
          this->Backtrace);
        return;
      }
      if (installNameDir.back() != '/') {
        installNameDir += '/';
      }
    }
    os << indent << "set(" << this->TmpVarPrefix << "_install_name_dir \""
       << installNameDir << "\")\n";
  }

  os << indent << "foreach(" << this->TmpVarPrefix << "_dep IN LISTS "
     << this->DepsVar << ")\n";

  if (!this->LocalGenerator->GetMakefile()
         ->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL")
         .empty()) {
    std::vector<std::string> evaluatedRPaths;
    for (auto const& rpath : this->InstallRPaths) {
      std::string result =
        cmGeneratorExpression::Evaluate(rpath, this->LocalGenerator, config);
      if (!result.empty()) {
        evaluatedRPaths.push_back(std::move(result));
      }
    }

    switch (this->Type) {
      case DependencyType::Library:
        this->GenerateAppleLibraryScript(os, config, evaluatedRPaths,
                                         indent.Next());
        break;
      case DependencyType::Framework:
        this->GenerateAppleFrameworkScript(os, config, evaluatedRPaths,
                                           indent.Next());
        break;
    }
  } else {
    std::string depVar = cmStrCat(this->TmpVarPrefix, "_dep");

    this->AddInstallRule(
      os, this->GetDestination(config), cmInstallType_SHARED_LIBRARY, {},
      false, this->Permissions.c_str(), nullptr, nullptr,
      " FOLLOW_SYMLINK_CHAIN", indent.Next(), depVar.c_str());

    if (this->LocalGenerator->GetMakefile()->GetSafeDefinition(
          "CMAKE_SYSTEM_NAME") == "Linux" &&
        !this->NoInstallRPath) {
      std::string evaluatedRPath;
      for (auto const& rpath : this->InstallRPaths) {
        std::string result =
          cmGeneratorExpression::Evaluate(rpath, this->LocalGenerator, config);
        if (!result.empty()) {
          if (evaluatedRPath.empty()) {
            evaluatedRPath = std::move(result);
          } else {
            evaluatedRPath += ':';
            evaluatedRPath += result;
          }
        }
      }

      os << indent.Next() << "get_filename_component(" << this->TmpVarPrefix
         << "_dep_name \"${" << this->TmpVarPrefix << "_dep}\" NAME)\n";
      if (evaluatedRPath.empty()) {
        os << indent.Next() << "file(RPATH_REMOVE FILE \""
           << GetDestDirPath(
                ConvertToAbsoluteDestination(this->GetDestination(config)))
           << "/${" << this->TmpVarPrefix << "_dep_name}\")\n";
      } else {
        os << indent.Next() << "file(RPATH_SET FILE \""
           << GetDestDirPath(
                ConvertToAbsoluteDestination(this->GetDestination(config)))
           << "/${" << this->TmpVarPrefix << "_dep_name}\" NEW_RPATH "
           << cmOutputConverter::EscapeForCMake(evaluatedRPath) << ")\n";
      }
    }
  }

  os << indent << "endforeach()\n";
}